

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O2

ostream * operator<<(ostream *os,BigInt *x)

{
  string local_30;
  
  BigInt::to_string_abi_cxx11_(&local_30,x);
  std::operator<<(os,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, BigInt& x) {
    os << x.to_string();
    return os;
}